

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

size_type __thiscall boost::filesystem::path::m_parent_path_end(path *this)

{
  size_type sVar1;
  long lVar2;
  value_type *pvVar3;
  undefined8 local_48;
  undefined1 local_39;
  undefined1 local_29;
  size_type root_dir_pos;
  size_type sStack_18;
  bool filename_was_separator;
  size_type end_pos;
  path *this_local;
  
  sVar1 = std::__cxx11::string::size();
  sStack_18 = anon_unknown.dwarf_f716::filename_pos(&this->m_pathname,sVar1);
  lVar2 = std::__cxx11::string::size();
  local_29 = false;
  if (lVar2 != 0) {
    pvVar3 = (value_type *)std::__cxx11::string::operator[]((ulong)this);
    local_29 = anon_unknown.dwarf_f716::is_separator(*pvVar3);
  }
  sVar1 = anon_unknown.dwarf_f716::root_directory_start(&this->m_pathname,sStack_18);
  while( true ) {
    local_39 = false;
    if ((sStack_18 != 0) && (local_39 = false, sStack_18 - 1 != sVar1)) {
      pvVar3 = (value_type *)std::__cxx11::string::operator[]((ulong)this);
      local_39 = anon_unknown.dwarf_f716::is_separator(*pvVar3);
    }
    if (local_39 == false) break;
    sStack_18 = sStack_18 - 1;
  }
  if (((sStack_18 == 1) && (sVar1 == 0)) && (local_29 != false)) {
    local_48 = 0xffffffffffffffff;
  }
  else {
    local_48 = sStack_18;
  }
  return local_48;
}

Assistant:

string_type::size_type path::m_parent_path_end() const
  {
    size_type end_pos(filename_pos(m_pathname, m_pathname.size()));

    bool filename_was_separator(m_pathname.size()
      && is_separator(m_pathname[end_pos]));

    // skip separators unless root directory
    size_type root_dir_pos(root_directory_start(m_pathname, end_pos));
    for (; 
      end_pos > 0
      && (end_pos-1) != root_dir_pos
      && is_separator(m_pathname[end_pos-1])
      ;
      --end_pos) {}

   return (end_pos == 1 && root_dir_pos == 0 && filename_was_separator)
     ? string_type::npos
     : end_pos;
  }